

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatchCommand.cxx
# Opt level: O0

void cmVariableWatchCommandVariableAccessed
               (string *variable,int access_type,void *client_data,char *newValue,cmMakefile *mf)

{
  long *this;
  undefined8 this_00;
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  ostream *poVar4;
  char *local_5b8;
  char *local_560;
  string local_508;
  undefined1 local_4e8 [8];
  ostringstream msg;
  string local_368;
  undefined1 local_348 [8];
  ostringstream error;
  cmExecutionStatus local_1cc;
  int local_1c8;
  cmExecutionStatus status;
  int local_1c0 [4];
  char *local_1b0;
  int local_1a4 [4];
  allocator<char> local_192;
  allocator<char> local_191;
  string local_190;
  undefined1 local_170 [8];
  string stack;
  cmMakefile *makefile;
  string local_140;
  char *local_120;
  char *currentListFile;
  char *local_108;
  char *accessString;
  undefined1 local_f8 [7];
  bool processed;
  cmListFileArgument arg;
  cmListFileFunction newLFF;
  cmVariableWatchCallbackData *data;
  cmMakefile *mf_local;
  char *newValue_local;
  void *client_data_local;
  int access_type_local;
  string *variable_local;
  
  if ((*client_data & 1) != 0) {
    return;
  }
  *(undefined1 *)client_data = 1;
  newLFF.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)client_data;
  cmListFileFunction::cmListFileFunction((cmListFileFunction *)&arg.ColEnd);
  cmListFileArgument::cmListFileArgument((cmListFileArgument *)local_f8);
  accessString._7_1_ = 0;
  local_108 = cmVariableWatch::GetAccessAsString(access_type);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"CMAKE_CURRENT_LIST_FILE",(allocator<char> *)((long)&makefile + 7)
            );
  pcVar2 = cmMakefile::GetDefinition(mf,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)((long)&makefile + 7));
  stack.field_2._8_8_ = mf;
  local_120 = pcVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"LISTFILE_STACK",&local_191);
  pcVar2 = cmMakefile::GetProperty(mf,&local_190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_170,pcVar2,&local_192);
  std::allocator<char>::~allocator(&local_192);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    this = &newLFF.super_cmCommandContext.EndCol;
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::clear
              ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)this);
    local_1a4[3] = 1;
    local_1a4[2] = 9999;
    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
    emplace_back<std::__cxx11::string_const&,cmListFileArgument::Delimiter,int>
              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)this,variable,
               (Delimiter *)(local_1a4 + 3),local_1a4 + 2);
    local_1a4[1] = 1;
    local_1a4[0] = 9999;
    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
    emplace_back<char_const*&,cmListFileArgument::Delimiter,int>
              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)
               &newLFF.super_cmCommandContext.EndCol,&local_108,(Delimiter *)(local_1a4 + 1),
               local_1a4);
    local_560 = newValue;
    if (newValue == (char *)0x0) {
      local_560 = "";
    }
    local_1b0 = local_560;
    local_1c0[3] = 1;
    local_1c0[2] = 9999;
    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
    emplace_back<char_const*,cmListFileArgument::Delimiter,int>
              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)
               &newLFF.super_cmCommandContext.EndCol,&local_1b0,(Delimiter *)(local_1c0 + 3),
               local_1c0 + 2);
    local_1c0[1] = 1;
    local_1c0[0] = 9999;
    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
    emplace_back<char_const*&,cmListFileArgument::Delimiter,int>
              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)
               &newLFF.super_cmCommandContext.EndCol,&local_120,(Delimiter *)(local_1c0 + 1),
               local_1c0);
    status.ReturnInvoked = true;
    status.BreakInvoked = false;
    status.ContinueInvoked = false;
    status.NestedError = false;
    local_1c8 = 9999;
    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
    emplace_back<std::__cxx11::string&,cmListFileArgument::Delimiter,int>
              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)
               &newLFF.super_cmCommandContext.EndCol,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170,
               (Delimiter *)&status,&local_1c8);
    cmCommandContext::cmCommandName::operator=
              ((cmCommandName *)&arg.ColEnd,
               (string *)
               &((newLFF.Arguments.
                  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage)->Value)._M_string_length);
    newLFF.super_cmCommandContext.Name.Original.field_2._8_8_ = 9999;
    cmExecutionStatus::cmExecutionStatus(&local_1cc);
    bVar1 = cmMakefile::ExecuteCommand
                      ((cmMakefile *)stack.field_2._8_8_,(cmListFileFunction *)&arg.ColEnd,
                       &local_1cc);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
      poVar4 = std::operator<<((ostream *)local_348,"Error in cmake code at\nUnknown:0:\n");
      poVar4 = std::operator<<(poVar4,"A command failed during the invocation of callback \"");
      poVar4 = std::operator<<(poVar4,(string *)
                                      &((newLFF.Arguments.
                                         super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->Value)
                                       ._M_string_length);
      std::operator<<(poVar4,"\".");
      std::__cxx11::ostringstream::str();
      cmSystemTools::Error(&local_368);
      std::__cxx11::string::~string((string *)&local_368);
      ((newLFF.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage)->Value)._M_dataplus = (_Alloc_hider)0x0;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
      goto LAB_0029ad47;
    }
    accessString._7_1_ = 1;
  }
  if ((accessString._7_1_ & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4e8);
    poVar4 = std::operator<<((ostream *)local_4e8,"Variable \"");
    poVar4 = std::operator<<(poVar4,(string *)variable);
    poVar4 = std::operator<<(poVar4,"\" was accessed using ");
    poVar4 = std::operator<<(poVar4,local_108);
    poVar4 = std::operator<<(poVar4," with value \"");
    local_5b8 = newValue;
    if (newValue == (char *)0x0) {
      local_5b8 = "";
    }
    poVar4 = std::operator<<(poVar4,local_5b8);
    std::operator<<(poVar4,"\".");
    this_00 = stack.field_2._8_8_;
    std::__cxx11::ostringstream::str();
    cmMakefile::IssueMessage((cmMakefile *)this_00,LOG,&local_508);
    std::__cxx11::string::~string((string *)&local_508);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4e8);
  }
  ((newLFF.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage)->Value)._M_dataplus = (_Alloc_hider)0x0;
LAB_0029ad47:
  std::__cxx11::string::~string((string *)local_170);
  cmListFileArgument::~cmListFileArgument((cmListFileArgument *)local_f8);
  cmListFileFunction::~cmListFileFunction((cmListFileFunction *)&arg.ColEnd);
  return;
}

Assistant:

static void cmVariableWatchCommandVariableAccessed(const std::string& variable,
                                                   int access_type,
                                                   void* client_data,
                                                   const char* newValue,
                                                   const cmMakefile* mf)
{
  cmVariableWatchCallbackData* data =
    static_cast<cmVariableWatchCallbackData*>(client_data);

  if (data->InCallback) {
    return;
  }
  data->InCallback = true;

  cmListFileFunction newLFF;
  cmListFileArgument arg;
  bool processed = false;
  const char* accessString = cmVariableWatch::GetAccessAsString(access_type);
  const char* currentListFile = mf->GetDefinition("CMAKE_CURRENT_LIST_FILE");

  /// Ultra bad!!
  cmMakefile* makefile = const_cast<cmMakefile*>(mf);

  std::string stack = makefile->GetProperty("LISTFILE_STACK");
  if (!data->Command.empty()) {
    newLFF.Arguments.clear();
    newLFF.Arguments.emplace_back(variable, cmListFileArgument::Quoted, 9999);
    newLFF.Arguments.emplace_back(accessString, cmListFileArgument::Quoted,
                                  9999);
    newLFF.Arguments.emplace_back(newValue ? newValue : "",
                                  cmListFileArgument::Quoted, 9999);
    newLFF.Arguments.emplace_back(currentListFile, cmListFileArgument::Quoted,
                                  9999);
    newLFF.Arguments.emplace_back(stack, cmListFileArgument::Quoted, 9999);
    newLFF.Name = data->Command;
    newLFF.Line = 9999;
    cmExecutionStatus status;
    if (!makefile->ExecuteCommand(newLFF, status)) {
      std::ostringstream error;
      error << "Error in cmake code at\nUnknown:0:\n"
            << "A command failed during the invocation of callback \""
            << data->Command << "\".";
      cmSystemTools::Error(error.str());
      data->InCallback = false;
      return;
    }
    processed = true;
  }
  if (!processed) {
    std::ostringstream msg;
    msg << "Variable \"" << variable << "\" was accessed using "
        << accessString << " with value \"" << (newValue ? newValue : "")
        << "\".";
    makefile->IssueMessage(MessageType::LOG, msg.str());
  }

  data->InCallback = false;
}